

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarBinds.h
# Opt level: O0

void __thiscall VarBind::VarBind(VarBind *this,VarBind *vb,shared_ptr<BER_CONTAINER> *value)

{
  element_type *peVar1;
  shared_ptr<BER_CONTAINER> *value_local;
  VarBind *vb_local;
  VarBind *this_local;
  
  Catch::clara::std::shared_ptr<OIDType>::shared_ptr(&this->oid,&vb->oid);
  peVar1 = Catch::clara::std::
           __shared_ptr_access<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)value);
  this->type = peVar1->_type;
  Catch::clara::std::shared_ptr<BER_CONTAINER>::shared_ptr(&this->value,value);
  this->errorStatus = NO_ERROR;
  return;
}

Assistant:

VarBind(const VarBind& vb, const std::shared_ptr<BER_CONTAINER>& value): oid(vb.oid), type(value->_type), value(value){}